

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cc
# Opt level: O0

void sptk::world::histc(double *x,int x_length,double *edges,int edges_length,int *index)

{
  int i;
  int count;
  int *index_local;
  int edges_length_local;
  double *edges_local;
  int x_length_local;
  double *x_local;
  
  count = 1;
  for (i = 0; (i < edges_length && (index[i] = 1, edges[i] < *x)); i = i + 1) {
  }
  for (; i < edges_length; i = i + 1) {
    if (x[count] <= edges[i]) {
      index[i] = count;
      i = i + -1;
      count = count + 1;
    }
    else {
      index[i] = count;
    }
    if (count == x_length) break;
  }
  while (i = i + 1, i < edges_length) {
    index[i] = count + -1;
  }
  return;
}

Assistant:

void histc(const double *x, int x_length, const double *edges,
    int edges_length, int *index) {
  int count = 1;

  int i = 0;
  for (; i < edges_length; ++i) {
    index[i] = 1;
    if (edges[i] >= x[0]) break;
  }
  for (; i < edges_length; ++i) {
    if (edges[i] < x[count]) {
      index[i] = count;
    } else {
      index[i--] = count++;
    }
    if (count == x_length) break;
  }
  count--;
  for (i++; i < edges_length; ++i) index[i] = count;
}